

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void stack_destroy_callback(stack *stack,stack_data_free_function free_function)

{
  stack_item *item;
  stack_item *curr;
  stack_data_free_function free_function_local;
  stack *stack_local;
  
  if (free_function == (stack_data_free_function)0x0) {
    stack_destroy(stack);
  }
  else {
    while (item = stack_pop(stack), item != (stack_item *)0x0) {
      (*free_function)(item->data);
      stack_item_destroy(item);
    }
    free(stack);
  }
  return;
}

Assistant:

void stack_destroy_callback(struct stack *stack, stack_data_free_function free_function)
{
        if (free_function == NULL) {
                stack_destroy(stack);

                return;
        }

        struct stack_item *curr = NULL;

        while ((curr = stack_pop(stack)) != NULL) {
                free_function((void *)curr->data);

                stack_item_destroy(curr);
        }

        free(stack);
}